

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasFoodWeb_bnd.c
# Opt level: O3

void SetInitialProfiles(N_Vector cc,N_Vector cp,N_Vector id,UserData webdata)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  
  lVar3 = N_VGetArrayPointer();
  lVar4 = N_VGetArrayPointer(cp);
  lVar5 = N_VGetArrayPointer(id);
  lVar2 = webdata->np;
  lVar6 = 0;
  do {
    dVar11 = (double)lVar6 * webdata->dy;
    lVar7 = 0;
    do {
      dVar12 = (double)lVar7 * webdata->dx;
      dVar12 = (1.0 - dVar12) * dVar12 * 16.0 * dVar11 * (1.0 - dVar11);
      uVar1 = lVar6 * 0x28 + lVar7 * 2;
      uVar8 = 0;
      do {
        if ((long)uVar8 < lVar2) {
          uVar9 = uVar8 | uVar1;
          *(double *)(lVar3 + uVar9 * 8) = (double)(long)(uVar8 + 1) * dVar12 * dVar12 + 10.0;
          *(undefined8 *)(lVar5 + uVar9 * 8) = 0x3ff0000000000000;
        }
        else {
          uVar9 = uVar8 | uVar1;
          *(undefined8 *)(lVar3 + uVar9 * 8) = 0x40f86a0000000000;
          *(undefined8 *)(lVar5 + uVar9 * 8) = 0;
        }
        bVar10 = uVar8 == 0;
        uVar8 = uVar8 + 1;
      } while (bVar10);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x14);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x14);
  Fweb(1.0,cc,cp,webdata);
  lVar4 = lVar4 + lVar2 * 8;
  lVar3 = 0;
  do {
    lVar5 = -0x140;
    do {
      if (lVar2 < 2) {
        memset((void *)(lVar4 + lVar5 + 0x140),0,lVar2 * -8 + 0x10);
      }
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0);
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x140;
  } while (lVar3 != 0x14);
  return;
}

Assistant:

static void SetInitialProfiles(N_Vector cc, N_Vector cp, N_Vector id,
                               UserData webdata)
{
  sunindextype loc, yloc, is, jx, jy, np;
  sunrealtype xx, yy, xyfactor;
  sunrealtype *ccv, *cpv, *idv;

  ccv = N_VGetArrayPointer(cc);
  cpv = N_VGetArrayPointer(cp);
  idv = N_VGetArrayPointer(id);
  np  = webdata->np;

  /* Loop over grid, load cc values and id values. */
  for (jy = 0; jy < MY; jy++)
  {
    yy   = jy * webdata->dy;
    yloc = NSMX * jy;
    for (jx = 0; jx < MX; jx++)
    {
      xx       = jx * webdata->dx;
      xyfactor = SUN_RCONST(16.0) * xx * (ONE - xx) * yy * (ONE - yy);
      xyfactor *= xyfactor;
      loc = yloc + NUM_SPECIES * jx;

      for (is = 0; is < NUM_SPECIES; is++)
      {
        if (is < np)
        {
          ccv[loc + is] = SUN_RCONST(10.0) + (sunrealtype)(is + 1) * xyfactor;
          idv[loc + is] = ONE;
        }
        else
        {
          ccv[loc + is] = SUN_RCONST(1.0e5);
          idv[loc + is] = ZERO;
        }
      }
    }
  }

  /* Set c' for the prey by calling the function Fweb. */
  Fweb(ZERO, cc, cp, webdata);

  /* Set c' for predators to 0. */
  for (jy = 0; jy < MY; jy++)
  {
    yloc = NSMX * jy;
    for (jx = 0; jx < MX; jx++)
    {
      loc = yloc + NUM_SPECIES * jx;
      for (is = np; is < NUM_SPECIES; is++) { cpv[loc + is] = ZERO; }
    }
  }
}